

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall ProgramOptions::run(ProgramOptions *this)

{
  pointer pcVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  shared_ptr<DataSet> ds;
  KrazyMeans km;
  ofstream result_out;
  ofstream points_out;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  KrazyMeans local_480;
  long local_428;
  filebuf local_420 [24];
  int aiStack_408 [54];
  ios_base aiStack_330 [264];
  long local_228;
  filebuf local_220 [24];
  int aiStack_208 [54];
  ios_base aiStack_130 [264];
  
  if (this->generate_benchmark == true) {
    generateBenchmark(this);
  }
  if (this->generate_example == true) {
    generateExample(this);
  }
  if ((this->input_file)._M_string_length != 0) {
    lVar3 = std::chrono::_V2::system_clock::now();
    DataSet::fromFile((DataSet *)local_4b0,&this->input_file);
    lVar4 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loading dataset           : ",0x1c);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    KrazyMeans::KrazyMeans
              (&local_480,(shared_ptr<DataSet> *)local_4b0,this->clusters,this->threshold_iters,
               this->scaling_factor);
    lVar3 = std::chrono::_V2::system_clock::now();
    KrazyMeans::initialize(&local_480);
    lVar4 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Algorithm initialization  : ",0x1c);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    lVar3 = std::chrono::_V2::system_clock::now();
    KrazyMeans::run(&local_480,false);
    lVar4 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reached convergence after : ",0x1c);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Iterations                : ",0x1c);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((this->output_file)._M_string_length == 0) {
      poVar5 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No output file was specified.",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    }
    else {
      lVar3 = std::chrono::_V2::system_clock::now();
      pcVar1 = (this->output_file)._M_dataplus._M_p;
      local_4a0._0_8_ = (pointer)(local_4a0 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4a0,pcVar1,pcVar1 + (this->output_file)._M_string_length);
      KrazyMeans::dumpLabels(&local_480,(string *)local_4a0);
      if ((pointer)local_4a0._0_8_ != (pointer)(local_4a0 + 0x10)) {
        operator_delete((void *)local_4a0._0_8_);
      }
      lVar4 = std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Writing result            : ",0x1c);
      poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (this->plot_outputs == true) {
      std::ofstream::ofstream(&local_228,"points.csv",_S_out);
      std::ofstream::ofstream(&local_428,"centroids.csv",_S_out);
      if ((*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) &&
         (*(int *)((long)aiStack_408 + *(long *)(local_428 + -0x18)) == 0)) {
        KrazyMeans::printState(&local_480,(ostream *)&local_228,(ostream *)&local_428);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Could not create CSV output files.",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
      }
      uVar2 = __filebuf;
      lVar3 = _VTT;
      local_428 = _VTT;
      *(undefined8 *)(local_420 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
      std::filebuf::~filebuf(local_420);
      std::ios_base::~ios_base(aiStack_330);
      local_228 = lVar3;
      *(undefined8 *)(local_220 + *(long *)(lVar3 + -0x18) + -8) = uVar2;
      std::filebuf::~filebuf(local_220);
      std::ios_base::~ios_base(aiStack_130);
    }
    std::vector<FeatureVec,_std::allocator<FeatureVec>_>::~vector(&local_480.centroids);
    if (local_480.labels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_480.labels.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_480.data_set.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_480.data_set.super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4b0._8_8_);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No input file was specified.",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void run() {
    if (generate_benchmark) generateBenchmark();
    if (generate_example) generateExample();

    if (!input_file.empty()) {
      Timer t;

      // Load data
      t.start();
      auto ds = DataSet::fromFile(input_file);
      t.stop();
      std::cout << "Loading dataset           : " << t.seconds() << " s." << std::endl;

      // Create KM context
      auto km = KrazyMeans(ds, clusters, threshold_iters, scaling_factor);

      // Initialize algorithm
      t.start();
      km.initialize();
      t.stop();
      std::cout << "Algorithm initialization  : " << t.seconds() << " s." << std::endl;

      // Run algorithm
      t.start();
      km.run(false);
      t.stop();
      std::cout << "Reached convergence after : " << t.seconds() << " s." << std::endl;
      std::cout << "Iterations                : " << km.iteration << std::endl;

      // Write labels to file
      if (!output_file.empty()) {
        t.start();
        km.dumpLabels(output_file);
        t.stop();
        std::cout << "Writing result            : " << t.seconds() << " s." << std::endl;
      } else {
        std::cerr << "No output file was specified." << std::endl;
      }

      if (plot_outputs) {
        std::ofstream points_out("points.csv");
        std::ofstream result_out("centroids.csv");

        if (points_out.good() && result_out.good()) {
          km.printState(points_out, result_out);
        } else {
          std::cerr << "Could not create CSV output files." << std::endl;
        }
      }
    } else {
      std::cerr << "No input file was specified." << std::endl;
    }
  }